

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_local.c
# Opt level: O1

int localSync(mpt_output *out,int timeout)

{
  _mpt_vptr_output *p_Var1;
  int iVar2;
  long *plVar3;
  mpt_output *out_1;
  long *local_10;
  
  local_10 = (long *)0x0;
  p_Var1 = out[3]._vptr;
  if ((p_Var1 == (_mpt_vptr_output *)0x0) ||
     (iVar2 = (**(code **)p_Var1->push)(p_Var1,0x83,&local_10), plVar3 = local_10, iVar2 < 0)) {
    plVar3 = (long *)0x0;
  }
  if (plVar3 == (long *)0x0) {
    iVar2 = -4;
  }
  else {
    iVar2 = (**(code **)(*plVar3 + 8))(plVar3,timeout);
  }
  return iVar2;
}

Assistant:

static int localSync(MPT_INTERFACE(output) *out, int timeout)
{
	if (!(out = localPassOutput(MPT_baseaddr(local_output, out, _out)))) {
		return MPT_ERROR(BadOperation);
	}
	return out->_vptr->sync(out, timeout);
}